

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdInitializeTxDataHandle(void *handle,int net_type,char *tx_hex_string,void **tx_data_handle)

{
  char *pcVar1;
  bool bVar2;
  void *pvVar3;
  ConfidentialTransactionContext *this;
  CfdException *pCVar4;
  bool is_bitcoin;
  bool local_56;
  allocator local_55;
  int local_54;
  undefined1 local_50 [32];
  
  local_54 = net_type;
  cfd::Initialize();
  if (tx_data_handle == (void **)0x0) {
    local_50._0_8_ = "cfdcapi_transaction.cpp";
    local_50._8_4_ = 0xd7d;
    local_50._16_8_ = "CfdInitializeTxDataHandle";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"tx data handle is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to parameter. tx data handle is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_50);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar2) {
    local_56 = false;
    cfd::capi::ConvertNetType(local_54,&local_56);
    if (local_56 == false) {
      local_50._0_8_ = "cfdcapi_transaction.cpp";
      local_50._8_4_ = 0xd8d;
      local_50._16_8_ = "CfdInitializeTxDataHandle";
      cfd::core::logger::log<int&>
                ((CfdSourceLocation *)local_50,kCfdLogLevelInfo,"net_type[{}]",&local_54);
    }
    pcVar1 = local_50 + 0x10;
    local_50._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"TransactionData","");
    pvVar3 = cfd::capi::AllocBuffer((string *)local_50,0x20);
    if ((char *)local_50._0_8_ != pcVar1) {
      operator_delete((void *)local_50._0_8_);
    }
    *(int *)((long)pvVar3 + 0x10) = local_54;
    if (local_56 == true) {
      this = (ConfidentialTransactionContext *)operator_new(0xb8);
      std::__cxx11::string::string((string *)local_50,tx_hex_string,&local_55);
      cfd::TransactionContext::TransactionContext((TransactionContext *)this,(string *)local_50);
    }
    else {
      this = (ConfidentialTransactionContext *)operator_new(0xb8);
      std::__cxx11::string::string((string *)local_50,tx_hex_string,&local_55);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(this,(string *)local_50);
    }
    if ((char *)local_50._0_8_ != pcVar1) {
      operator_delete((void *)local_50._0_8_);
    }
    *(ConfidentialTransactionContext **)((long)pvVar3 + 0x18) = this;
    *tx_data_handle = pvVar3;
    return 0;
  }
  local_50._0_8_ = "cfdcapi_transaction.cpp";
  local_50._8_4_ = 0xd83;
  local_50._16_8_ = "CfdInitializeTxDataHandle";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"tx_hex is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. tx_hex is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeTxDataHandle(
    void* handle, int net_type, const char* tx_hex_string,
    void** tx_data_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiTransactionData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (tx_data_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "tx data handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx data handle is null.");
    }
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (!is_bitcoin) {
#ifndef CFD_DISABLE_ELEMENTS
      info(CFD_LOG_SOURCE, "net_type[{}]", net_type);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    buffer = static_cast<CfdCapiTransactionData*>(
        AllocBuffer(kPrefixTransactionData, sizeof(CfdCapiTransactionData)));
    buffer->net_type = net_type;
    if (is_bitcoin) {
      TransactionContext* tx =
          new TransactionContext(std::string(tx_hex_string));
      buffer->tx_obj = tx;
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          new ConfidentialTransactionContext(std::string(tx_hex_string));
      buffer->tx_obj = tx;
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    *tx_data_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreeTxDataHandle(handle, buffer);
  return result;
}